

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512_masked_ops(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  undefined1 (*in_RDX) [64];
  uint in_ESI;
  long in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  int i;
  __m512i ones;
  __m512i counter;
  undefined4 local_404;
  undefined1 local_3c0 [64];
  undefined4 local_344;
  
  auVar4 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar4 = vmovdqa64_avx512f(auVar4);
  local_3c0 = vmovdqa64_avx512f(auVar4);
  auVar4 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  for (local_404 = 0; local_404 < in_ESI; local_404 = local_404 + 1) {
    auVar5 = vmovdqa64_avx512f(local_3c0);
    uVar1 = *(ushort *)(in_RDI + (long)(int)local_404 * 2);
    auVar6 = vmovdqa64_avx512f(auVar4);
    auVar7 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar5 = vpaddd_avx512f(auVar5,auVar6);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar6._0_4_ = (uint)bVar2 * auVar5._0_4_ | (uint)!bVar2 * auVar7._0_4_;
    bVar2 = (bool)((byte)(uVar1 >> 1) & 1);
    auVar6._4_4_ = (uint)bVar2 * auVar5._4_4_ | (uint)!bVar2 * auVar7._4_4_;
    bVar2 = (bool)((byte)(uVar1 >> 2) & 1);
    auVar6._8_4_ = (uint)bVar2 * auVar5._8_4_ | (uint)!bVar2 * auVar7._8_4_;
    bVar2 = (bool)((byte)(uVar1 >> 3) & 1);
    auVar6._12_4_ = (uint)bVar2 * auVar5._12_4_ | (uint)!bVar2 * auVar7._12_4_;
    bVar2 = (bool)((byte)(uVar1 >> 4) & 1);
    auVar6._16_4_ = (uint)bVar2 * auVar5._16_4_ | (uint)!bVar2 * auVar7._16_4_;
    bVar2 = (bool)((byte)(uVar1 >> 5) & 1);
    auVar6._20_4_ = (uint)bVar2 * auVar5._20_4_ | (uint)!bVar2 * auVar7._20_4_;
    bVar2 = (bool)((byte)(uVar1 >> 6) & 1);
    auVar6._24_4_ = (uint)bVar2 * auVar5._24_4_ | (uint)!bVar2 * auVar7._24_4_;
    bVar2 = (bool)((byte)(uVar1 >> 7) & 1);
    auVar6._28_4_ = (uint)bVar2 * auVar5._28_4_ | (uint)!bVar2 * auVar7._28_4_;
    bVar3 = (byte)(uVar1 >> 8);
    auVar6._32_4_ = (uint)(bVar3 & 1) * auVar5._32_4_ | (uint)!(bool)(bVar3 & 1) * auVar7._32_4_;
    bVar2 = (bool)(bVar3 >> 1 & 1);
    auVar6._36_4_ = (uint)bVar2 * auVar5._36_4_ | (uint)!bVar2 * auVar7._36_4_;
    bVar2 = (bool)(bVar3 >> 2 & 1);
    auVar6._40_4_ = (uint)bVar2 * auVar5._40_4_ | (uint)!bVar2 * auVar7._40_4_;
    bVar2 = (bool)(bVar3 >> 3 & 1);
    auVar6._44_4_ = (uint)bVar2 * auVar5._44_4_ | (uint)!bVar2 * auVar7._44_4_;
    bVar2 = (bool)(bVar3 >> 4 & 1);
    auVar6._48_4_ = (uint)bVar2 * auVar5._48_4_ | (uint)!bVar2 * auVar7._48_4_;
    bVar2 = (bool)(bVar3 >> 5 & 1);
    auVar6._52_4_ = (uint)bVar2 * auVar5._52_4_ | (uint)!bVar2 * auVar7._52_4_;
    bVar2 = (bool)(bVar3 >> 6 & 1);
    auVar6._56_4_ = (uint)bVar2 * auVar5._56_4_ | (uint)!bVar2 * auVar7._56_4_;
    auVar6._60_4_ = (uint)(bVar3 >> 7) * auVar5._60_4_ | (uint)!(bool)(bVar3 >> 7) * auVar7._60_4_;
    local_3c0 = vmovdqa64_avx512f(auVar6);
  }
  auVar4 = vmovdqa64_avx512f(local_3c0);
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqu64_avx512f(auVar4);
  *in_RDX = auVar4;
  return local_344;
}

Assistant:

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (int i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
}